

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::ExpectErrorSubstring
          (CommandLineInterfaceTester *this,string_view expected_substring)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  substring;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  char *pcVar1;
  AssertionResult AVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  long local_78 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68 [2];
  long local_58 [2];
  size_t local_48;
  char *local_40;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_40 = expected_substring._M_str;
  local_48 = expected_substring._M_len;
  local_68[0]._M_head_impl = local_68[0]._M_head_impl & 0xffffffff00000000;
  AVar2 = testing::internal::CmpHelperNE<int,int>
                    ((internal *)&local_88,"0","return_code_",(int *)local_68,&this->return_code_);
  substring._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_88._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0x8c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    substring = extraout_RDX.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    if (local_68[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_68[0]._M_head_impl + 8))();
      substring._M_head_impl = extraout_RDX_00;
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
    substring._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  testing::HasSubstr<std::basic_string_view<char,std::char_traits<char>>>
            (&local_38,(testing *)&local_48,
             (StringLike<std::basic_string_view<char>_> *)substring._M_head_impl);
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_38.impl_.substring_._M_dataplus._M_p,
             local_38.impl_.substring_._M_dataplus._M_p + local_38.impl_.substring_._M_string_length
            );
  local_68[0]._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,local_88._M_head_impl,
             local_88._M_head_impl + (long)&(local_80->_M_dataplus)._M_p);
  if (local_88._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78) {
    operator_delete(local_88._M_head_impl,local_78[0] + 1);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&local_98,(char *)local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "captured_stderr_");
  if (local_68[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58) {
    operator_delete(local_68[0]._M_head_impl,local_58[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.impl_.substring_._M_dataplus._M_p != &local_38.impl_.substring_.field_2) {
    operator_delete(local_38.impl_.substring_._M_dataplus._M_p,
                    local_38.impl_.substring_.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_98.data_ == '\0') {
    testing::Message::Message((Message *)&local_88);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0x8d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  return;
}

Assistant:

void CommandLineInterfaceTester::ExpectErrorSubstring(
    absl::string_view expected_substring) {
  EXPECT_NE(0, return_code_);
  EXPECT_THAT(captured_stderr_, HasSubstr(expected_substring));
}